

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O0

yyjson_val *
duckdb_yyjson::unsafe_yyjson_ptr_getx(yyjson_val *val,char *ptr,size_t ptr_len,yyjson_ptr_err *err)

{
  int iVar1;
  undefined4 *in_RCX;
  byte *pbVar2;
  long in_RDX;
  byte *in_RSI;
  yyjson_val *in_RDI;
  bool bVar3;
  yyjson_type type;
  usize esc;
  usize len;
  char *token;
  char *end;
  char *hdr;
  uint8_t tag;
  usize esc_num;
  char *cur;
  char *hdr_1;
  usize num;
  yyjson_val *key;
  size_t ofs;
  size_t ctn_ofs;
  bool is_ctn;
  usize idx;
  usize num_1;
  yyjson_val *val_2;
  size_t ofs_2;
  size_t ctn_ofs_1;
  bool is_ctn_1;
  uint8_t mask_1;
  uint8_t mask;
  char *str;
  yyjson_val *val_1;
  usize add;
  usize num_2;
  char *end_1;
  size_t len_1;
  size_t ofs_1;
  uint8_t tag_1;
  uint8_t tag_2;
  char *local_270;
  bool local_263;
  bool local_261;
  char *local_260;
  byte local_24d;
  long local_248;
  byte *local_240;
  byte *local_238;
  byte *local_230;
  byte *local_228;
  undefined4 *local_220;
  byte *local_210;
  yyjson_val *local_208;
  byte local_1f1;
  yyjson_val *local_1f0;
  long local_1e8;
  byte *local_1e0;
  byte *local_1d8;
  long *local_1d0;
  byte **local_1c8;
  byte *local_1c0;
  byte **local_1b8;
  byte *local_1b0;
  ulong local_1a8;
  yyjson_val *local_1a0;
  long local_198;
  byte *local_190;
  byte *local_188;
  yyjson_val *local_180;
  yyjson_val *local_178;
  char *local_170;
  char *local_168;
  undefined1 local_159;
  yyjson_val *local_158;
  yyjson_val *local_150;
  yyjson_val *local_148;
  ulong local_140;
  ulong local_138;
  yyjson_val *local_130;
  long local_128;
  byte *local_120;
  byte *local_118;
  yyjson_val *local_110;
  yyjson_val *local_108;
  char *local_100;
  char *local_f8;
  undefined1 local_e9;
  yyjson_val *local_e8;
  yyjson_val *local_e0;
  yyjson_val *local_d8;
  undefined1 local_c9;
  yyjson_val *local_c8;
  undefined1 local_b9;
  yyjson_val *local_b8;
  byte *local_b0;
  yyjson_val *local_a8;
  long local_a0;
  byte *local_98;
  byte *local_90;
  yyjson_val *local_88;
  bool local_79;
  yyjson_val *local_78;
  ulong local_70;
  ulong local_68;
  byte *local_60;
  ulong *local_58;
  byte *local_50;
  byte *local_48;
  byte local_39;
  ulong local_38;
  uint64_t local_30;
  yyjson_val *local_28;
  byte local_19;
  yyjson_val *local_18;
  byte local_9;
  yyjson_val *local_8;
  
  local_230 = in_RSI + in_RDX;
  local_228 = in_RSI;
  local_220 = in_RCX;
  local_210 = in_RSI;
  local_208 = in_RDI;
  do {
    local_1b8 = &local_210;
    local_1c0 = local_230;
    local_1c8 = &local_240;
    local_1d0 = &local_248;
    local_1d8 = local_210 + 1;
    local_1e0 = local_1d8;
    while( true ) {
      bVar3 = false;
      if ((local_1e0 < local_230) && (bVar3 = false, *local_1e0 != 0x2f)) {
        bVar3 = *local_1e0 != 0x7e;
      }
      if (!bVar3) break;
      local_1e0 = local_1e0 + 1;
    }
    bVar3 = true;
    if (local_1e0 != local_230) {
      bVar3 = *local_1e0 != 0x7e;
    }
    local_1b0 = local_1d8;
    if (bVar3) {
      local_210 = local_1e0;
      local_240 = local_1e0 + -(long)local_1d8;
      local_248 = 0;
    }
    else {
      local_1e8 = 0;
      pbVar2 = local_1e0;
      while( true ) {
        local_1e0 = pbVar2;
        bVar3 = false;
        if (local_1e0 < local_230) {
          bVar3 = *local_1e0 != 0x2f;
        }
        if (!bVar3) break;
        pbVar2 = local_1e0 + 1;
        if (*local_1e0 == 0x7e) {
          if ((pbVar2 == local_230) || ((*pbVar2 != 0x30 && (*pbVar2 != 0x31)))) {
            local_210 = local_1e0;
            local_1b0 = (byte *)0x0;
            local_1e0 = pbVar2;
            goto LAB_027480ef;
          }
          local_1e8 = local_1e8 + 1;
        }
      }
      local_210 = local_1e0;
      local_240 = local_1e0 + (-local_1e8 - (long)local_1d8);
      local_248 = local_1e8;
    }
LAB_027480ef:
    local_238 = local_1b0;
    if (local_1b0 == (byte *)0x0) {
      if (local_220 != (undefined4 *)0x0) {
        *local_220 = 2;
        *(char **)(local_220 + 2) = "invalid escaped character";
        *(long *)(local_220 + 4) = (long)local_210 - (long)local_228;
      }
      return (yyjson_val *)0x0;
    }
    local_1f0 = local_208;
    local_1f1 = (byte)local_208->tag;
    if ((local_1f1 & 7) == 7) {
      local_180 = local_208;
      local_188 = local_1b0;
      local_190 = local_240;
      local_198 = local_248;
      local_148 = local_208;
      local_1a0 = local_208 + 1;
      local_150 = local_208;
      local_1a8 = local_208->tag >> 8;
      if (local_1a8 == 0) {
        local_178 = (yyjson_val *)0x0;
      }
      else {
        while (local_1a8 != 0) {
          local_88 = local_1a0;
          local_90 = local_188;
          local_98 = local_190;
          local_a0 = local_198;
          local_a8 = local_1a0;
          local_78 = local_1a0;
          if ((byte *)(local_1a0->tag >> 8) == local_190) {
            if (local_198 == 0) {
              iVar1 = memcmp((local_1a0->uni).ptr,local_188,(size_t)local_190);
              local_79 = iVar1 == 0;
            }
            else {
              local_b0 = (byte *)(local_1a0->uni).str;
              while (local_98 != (byte *)0x0) {
                if (*local_90 == 0x7e) {
                  local_24d = 0x7e;
                  if (local_90[1] != 0x30) {
                    local_24d = 0x2f;
                  }
                  local_90 = local_90 + 1;
                  if (*local_b0 != local_24d) {
                    local_79 = false;
                    goto LAB_02748416;
                  }
                }
                else if (*local_b0 != *local_90) {
                  local_79 = false;
                  goto LAB_02748416;
                }
                local_90 = local_90 + 1;
                local_b0 = local_b0 + 1;
                local_98 = local_98 + -1;
              }
              local_79 = true;
            }
          }
          else {
            local_79 = false;
          }
LAB_02748416:
          if (local_79 != false) {
            local_178 = local_1a0 + 1;
            goto LAB_0274853c;
          }
          local_1a8 = local_1a8 - 1;
          local_158 = local_1a0 + 1;
          local_b9 = 6;
          local_19 = (byte)local_158->tag;
          local_159 = (local_19 & 6) == 6;
          local_168 = local_1a0[1].uni.str;
          local_260 = local_168;
          if (!(bool)local_159) {
            local_260 = (char *)0x10;
          }
          local_170 = local_260;
          local_1a0 = (yyjson_val *)(local_260 + (long)&local_158->tag);
          local_b8 = local_158;
          local_18 = local_158;
        }
        local_178 = (yyjson_val *)0x0;
      }
LAB_0274853c:
      local_208 = local_178;
    }
    else if ((local_1f1 & 7) == 6) {
      local_110 = local_208;
      local_118 = local_1b0;
      local_120 = local_240;
      local_128 = local_248;
      local_d8 = local_208;
      local_130 = local_208 + 1;
      local_e0 = local_208;
      local_138 = local_208->tag >> 8;
      local_140 = 0;
      if (local_138 == 0) {
        local_108 = (yyjson_val *)0x0;
      }
      else {
        local_48 = local_1b0;
        local_50 = local_240;
        local_58 = &local_140;
        local_60 = local_1b0 + (long)local_240;
        local_68 = 0;
        local_261 = local_240 == (byte *)0x0 || (byte *)0x13 < local_240;
        if (local_261) {
          local_39 = 0;
        }
        else if (*local_1b0 == 0x30) {
          if (local_240 < (byte *)0x2) {
            local_140 = 0;
            local_39 = 1;
          }
          else {
            local_39 = 0;
          }
        }
        else if (*local_1b0 == 0x2d) {
          if (local_240 < (byte *)0x2) {
            local_140 = 0xffffffffffffffff;
            local_39 = 1;
          }
          else {
            local_39 = 0;
          }
        }
        else {
          while( true ) {
            bVar3 = false;
            if (local_48 < local_60) {
              local_70 = (ulong)(int)(*local_48 - 0x30);
              bVar3 = local_70 < 10;
            }
            if (!bVar3) break;
            local_68 = local_68 * 10 + local_70;
            local_48 = local_48 + 1;
          }
          local_263 = local_68 == 0 || local_48 < local_60;
          if (local_263) {
            local_39 = 0;
          }
          else {
            local_140 = local_68;
            local_39 = 1;
          }
        }
        if (((local_39 ^ 0xff) & 1) == 0) {
          if (local_140 < local_138) {
            local_28 = local_208;
            local_30 = (local_208->uni).u64;
            local_38 = local_208->tag >> 8;
            if (local_38 * 0x10 + 0x10 == local_30) {
              local_108 = local_130 + local_140;
            }
            else {
              while (local_140 != 0) {
                local_e8 = local_130;
                local_c8 = local_130;
                local_c9 = 6;
                local_8 = local_130;
                local_9 = (byte)local_130->tag;
                local_e9 = (local_9 & 6) == 6;
                local_f8 = (local_130->uni).str;
                local_270 = local_f8;
                if (!(bool)local_e9) {
                  local_270 = (char *)0x10;
                }
                local_100 = local_270;
                local_130 = (yyjson_val *)(local_270 + (long)&local_130->tag);
                local_140 = local_140 - 1;
              }
              local_108 = local_130;
              local_140 = local_140 - 1;
            }
          }
          else {
            local_108 = (yyjson_val *)0x0;
          }
        }
        else {
          local_108 = (yyjson_val *)0x0;
        }
      }
      local_208 = local_108;
    }
    else {
      local_208 = (yyjson_val *)0x0;
    }
    if (local_208 == (yyjson_val *)0x0) {
      if (local_220 != (undefined4 *)0x0) {
        *local_220 = 3;
        *(char **)(local_220 + 2) = "JSON pointer cannot be resolved";
        *(long *)(local_220 + 4) = (long)local_238 - (long)local_228;
      }
      return (yyjson_val *)0x0;
    }
    if (local_210 == local_230) {
      return local_208;
    }
  } while( true );
}

Assistant:

yyjson_val *unsafe_yyjson_ptr_getx(yyjson_val *val,
                                   const char *ptr, size_t ptr_len,
                                   yyjson_ptr_err *err) {

    const char *hdr = ptr, *end = ptr + ptr_len, *token;
    usize len, esc;
    yyjson_type type;

    while (true) {
        token = ptr_next_token(&ptr, end, &len, &esc);
        if (unlikely(!token)) return_err_syntax(NULL, ptr - hdr);
        type = unsafe_yyjson_get_type(val);
        if (type == YYJSON_TYPE_OBJ) {
            val = ptr_obj_get(val, token, len, esc);
        } else if (type == YYJSON_TYPE_ARR) {
            val = ptr_arr_get(val, token, len, esc);
        } else {
            val = NULL;
        }
        if (!val) return_err_resolve(NULL, token - hdr);
        if (ptr == end) return val;
    }
}